

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimization.cc
# Opt level: O0

void re2c::minimization(dfa_t *dfa)

{
  dfa_state_t *this;
  size_t *psVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  dfa_state_t *pdVar4;
  ulong uVar5;
  size_t *part_00;
  opt_t *poVar6;
  void *pvVar7;
  reference ppdVar8;
  ulong local_60;
  size_t c;
  size_t *arcs;
  dfa_state_t *s;
  size_t i_1;
  size_t new_count;
  size_t j;
  size_t i;
  size_t *compact;
  size_t *part;
  size_t count;
  dfa_t *dfa_local;
  
  pdVar4 = (dfa_state_t *)
           std::vector<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>::size
                     (&dfa->states);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = pdVar4;
  uVar5 = SUB168(auVar2 * ZEXT816(8),0);
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  part_00 = (size_t *)operator_new__(uVar5);
  poVar6 = Opt::operator->((Opt *)&opts);
  if (poVar6->dfa_minimization == DFA_MINIMIZATION_TABLE) {
    minimization_table(part_00,&dfa->states,dfa->nchars);
  }
  else if (poVar6->dfa_minimization == DFA_MINIMIZATION_MOORE) {
    minimization_moore(part_00,&dfa->states,dfa->nchars);
  }
  auVar3._8_8_ = 0;
  auVar3._0_8_ = pdVar4;
  uVar5 = SUB168(auVar3 * ZEXT816(8),0);
  if (SUB168(auVar3 * ZEXT816(8),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  pvVar7 = operator_new__(uVar5);
  new_count = 0;
  for (j = 0; j < pdVar4; j = j + 1) {
    if (j == part_00[j]) {
      *(size_t *)((long)pvVar7 + j * 8) = new_count;
      new_count = new_count + 1;
    }
  }
  i_1 = 0;
  for (s = (dfa_state_t *)0x0; s < pdVar4; s = (dfa_state_t *)((long)&s->arcs + 1)) {
    ppdVar8 = std::vector<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>::operator[]
                        (&dfa->states,(size_type)s);
    this = *ppdVar8;
    if (s == (dfa_state_t *)part_00[(long)s]) {
      psVar1 = this->arcs;
      for (local_60 = 0; local_60 < dfa->nchars; local_60 = local_60 + 1) {
        if (psVar1[local_60] != 0xffffffffffffffff) {
          psVar1[local_60] = *(size_t *)((long)pvVar7 + part_00[psVar1[local_60]] * 8);
        }
      }
      ppdVar8 = std::vector<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>::operator[]
                          (&dfa->states,i_1);
      *ppdVar8 = this;
      i_1 = i_1 + 1;
    }
    else if (this != (dfa_state_t *)0x0) {
      dfa_state_t::~dfa_state_t(this);
      operator_delete(this,0x18);
    }
  }
  std::vector<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>::resize(&dfa->states,i_1);
  if (pvVar7 != (void *)0x0) {
    operator_delete__(pvVar7);
  }
  if (part_00 != (size_t *)0x0) {
    operator_delete__(part_00);
  }
  return;
}

Assistant:

void minimization(dfa_t &dfa)
{
	const size_t count = dfa.states.size();

	size_t *part = new size_t[count];

	switch (opts->dfa_minimization)
	{
		case DFA_MINIMIZATION_TABLE:
			minimization_table(part, dfa.states, dfa.nchars);
			break;
		case DFA_MINIMIZATION_MOORE:
			minimization_moore(part, dfa.states, dfa.nchars);
			break;
	}

	size_t *compact = new size_t[count];
	for (size_t i = 0, j = 0; i < count; ++i)
	{
		if (i == part[i])
		{
			compact[i] = j++;
		}
	}

	size_t new_count = 0;
	for (size_t i = 0; i < count; ++i)
	{
		dfa_state_t *s = dfa.states[i];
		if (i == part[i])
		{
			size_t *arcs = s->arcs;
			for (size_t c = 0; c < dfa.nchars; ++c)
			{
				if (arcs[c] != dfa_t::NIL)
				{
					arcs[c] = compact[part[arcs[c]]];
				}
			}
			dfa.states[new_count++] = s;
		}
		else
		{
			delete s;
		}
	}
	dfa.states.resize(new_count);

	delete[] compact;
	delete[] part;
}